

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkDistance.cpp
# Opt level: O1

void __thiscall
chrono::ChLinkDistance::ConstraintsBiLoad_C
          (ChLinkDistance *this,double factor,double recovery_clamp,bool do_clamp)

{
  undefined1 auVar1 [16];
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  undefined1 auVar6 [16];
  double dVar7;
  undefined1 auVar8 [16];
  undefined8 in_XMM1_Qb;
  undefined1 auVar9 [16];
  
  iVar5 = (*(this->super_ChLink).super_ChLinkBase.super_ChPhysicsItem.super_ChObj._vptr_ChObj[9])();
  if ((char)iVar5 != '\0') {
    dVar7 = (this->Cx).super_ChConstraintTwo.super_ChConstraint.b_i;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = dVar7;
    dVar2 = this->curr_dist - this->distance;
    if (do_clamp) {
      auVar4._8_8_ = in_XMM1_Qb;
      auVar4._0_8_ = recovery_clamp;
      auVar3._8_8_ = 0x8000000000000000;
      auVar3._0_8_ = 0x8000000000000000;
      auVar6 = vxorpd_avx512vl(auVar4,auVar3);
      auVar8._8_8_ = 0;
      auVar8._0_8_ = dVar2 * factor;
      auVar6 = vmaxsd_avx(auVar8,auVar6);
      auVar6 = vminsd_avx(auVar6,auVar4);
      dVar7 = dVar7 + auVar6._0_8_;
    }
    else {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = factor;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = dVar2;
      auVar6 = vfmadd132sd_fma(auVar9,auVar6,auVar1);
      dVar7 = auVar6._0_8_;
    }
    (this->Cx).super_ChConstraintTwo.super_ChConstraint.b_i = dVar7;
  }
  return;
}

Assistant:

void ChLinkDistance::ConstraintsBiLoad_C(double factor, double recovery_clamp, bool do_clamp) {
    if (!IsActive())
        return;

    if (do_clamp)
        Cx.Set_b_i(Cx.Get_b_i() + ChMin(ChMax(factor * (curr_dist - distance), -recovery_clamp), recovery_clamp));
    else
        Cx.Set_b_i(Cx.Get_b_i() + factor * (curr_dist - distance));
}